

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

int mj_write_jpeg_to_file(mj_jpeg_t *m,char *filename,int options)

{
  uchar *__ptr;
  int iVar1;
  FILE *__s;
  size_t len;
  uchar *buffer;
  
  buffer = (uchar *)0x0;
  len = 0;
  if (m == (mj_jpeg_t *)0x0) {
    iVar1 = 2;
  }
  else {
    __s = fopen(filename,"wb");
    if (__s == (FILE *)0x0) {
      iVar1 = 7;
    }
    else {
      mj_write_jpeg_to_memory(m,&buffer,&len,options);
      __ptr = buffer;
      fwrite(buffer,1,len,__s);
      fclose(__s);
      free(__ptr);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mj_write_jpeg_to_file(mj_jpeg_t *m, char *filename, int options) {
    FILE *         fp;
    unsigned char *buffer = NULL;
    size_t         len = 0;

    if(m == NULL) {
        return MJ_ERR_NULL_DATA;
    }

    fp = fopen(filename, "wb");
    if(fp == NULL) {
        return MJ_ERR_FILEIO;
    }

    mj_write_jpeg_to_memory(m, &buffer, &len, options);

    fwrite(buffer, 1, len, fp);
    fclose(fp);

    free(buffer);

    return MJ_OK;
}